

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  long lVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  undefined4 uVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  Scene *pSVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  vint4 bi_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 ai;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [64];
  uint uVar75;
  uint uVar76;
  uint uVar77;
  undefined1 auVar74 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1350 [16];
  Scene *local_1338;
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  ulong local_12e8;
  ulong local_12e0;
  long local_12d8;
  ulong local_12d0;
  long local_12c8;
  RTCFilterFunctionNArguments local_12c0;
  undefined8 local_1290;
  undefined8 uStack_1288;
  undefined1 local_1280 [32];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1150 [16];
  float local_1140 [4];
  float local_1130 [4];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined4 local_10a0;
  undefined4 uStack_109c;
  undefined4 uStack_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 uStack_1088;
  undefined4 uStack_1084;
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar52 [32];
  undefined1 auVar56 [32];
  
  pauVar27 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar59 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_11f0._4_4_ = fVar59;
  local_11f0._0_4_ = fVar59;
  local_11f0._8_4_ = fVar59;
  local_11f0._12_4_ = fVar59;
  auVar65 = ZEXT1664(local_11f0);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1200._4_4_ = fVar66;
  local_1200._0_4_ = fVar66;
  local_1200._8_4_ = fVar66;
  local_1200._12_4_ = fVar66;
  auVar70 = ZEXT1664(local_1200);
  fVar71 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1210._4_4_ = fVar71;
  local_1210._0_4_ = fVar71;
  local_1210._8_4_ = fVar71;
  local_1210._12_4_ = fVar71;
  auVar74 = ZEXT1664(local_1210);
  fVar59 = fVar59 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar66 = fVar66 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar71 = fVar71 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar26 = uVar20 ^ 0x10;
  uVar28 = uVar22 ^ 0x10;
  iVar8 = (tray->tfar).field_0.i[k];
  auVar39 = ZEXT1664(CONCAT412(iVar8,CONCAT48(iVar8,CONCAT44(iVar8,iVar8))));
  local_1220._8_4_ = 0x80000000;
  local_1220._0_8_ = 0x8000000080000000;
  local_1220._12_4_ = 0x80000000;
  local_1230._0_8_ = CONCAT44(fVar59,fVar59) ^ 0x8000000080000000;
  local_1230._8_4_ = -fVar59;
  local_1230._12_4_ = -fVar59;
  auVar80 = ZEXT1664(local_1230);
  local_1240._0_8_ = CONCAT44(fVar66,fVar66) ^ 0x8000000080000000;
  local_1240._8_4_ = -fVar66;
  local_1240._12_4_ = -fVar66;
  auVar82 = ZEXT1664(local_1240);
  local_1250._0_8_ = CONCAT44(fVar71,fVar71) ^ 0x8000000080000000;
  local_1250._8_4_ = -fVar71;
  local_1250._12_4_ = -fVar71;
  auVar85 = ZEXT1664(local_1250);
  iVar8 = (tray->tnear).field_0.i[k];
  local_1260._4_4_ = iVar8;
  local_1260._0_4_ = iVar8;
  local_1260._8_4_ = iVar8;
  local_1260._12_4_ = iVar8;
  auVar87 = ZEXT1664(local_1260);
  iVar8 = 1 << ((uint)k & 0x1f);
  auVar47._4_4_ = iVar8;
  auVar47._0_4_ = iVar8;
  auVar47._8_4_ = iVar8;
  auVar47._12_4_ = iVar8;
  auVar47._16_4_ = iVar8;
  auVar47._20_4_ = iVar8;
  auVar47._24_4_ = iVar8;
  auVar47._28_4_ = iVar8;
  auVar52 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar47 = vpand_avx2(auVar47,auVar52);
  local_10e0 = vpcmpeqd_avx2(auVar47,auVar52);
  local_12e8 = uVar22;
  local_12e0 = uVar20;
LAB_015eee54:
  do {
    do {
      if (pauVar27 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar7 = pauVar27 + -1;
      pauVar27 = pauVar27 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar7 + 8));
    uVar15 = *(ulong *)*pauVar27;
    while ((uVar15 & 8) == 0) {
      uVar10 = uVar15 & 0xfffffffffffffff0;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar40._4_4_ = uVar9;
      auVar40._0_4_ = uVar9;
      auVar40._8_4_ = uVar9;
      auVar40._12_4_ = uVar9;
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar20),auVar40,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar20));
      auVar36 = vfmadd213ps_fma(auVar36,auVar65._0_16_,auVar80._0_16_);
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar22),auVar40,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar22));
      auVar41 = vfmadd213ps_fma(auVar41,auVar70._0_16_,auVar82._0_16_);
      auVar36 = vpmaxsd_avx(auVar36,auVar41);
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar17),auVar40,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar17));
      auVar41 = vfmadd213ps_fma(auVar41,auVar74._0_16_,auVar85._0_16_);
      auVar41 = vpmaxsd_avx(auVar41,auVar87._0_16_);
      auVar36 = vpmaxsd_avx(auVar36,auVar41);
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar26),auVar40,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar26));
      auVar41 = vfmadd213ps_fma(auVar41,auVar65._0_16_,auVar80._0_16_);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar28),auVar40,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar28));
      auVar53 = vfmadd213ps_fma(auVar53,auVar70._0_16_,auVar82._0_16_);
      auVar41 = vpminsd_avx(auVar41,auVar53);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + (uVar17 ^ 0x10)),auVar40,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + (uVar17 ^ 0x10)));
      auVar53 = vfmadd213ps_fma(auVar53,auVar74._0_16_,auVar85._0_16_);
      auVar53 = vpminsd_avx(auVar53,auVar39._0_16_);
      auVar41 = vpminsd_avx(auVar41,auVar53);
      if (((uint)uVar15 & 7) == 6) {
        auVar53 = vcmpps_avx(auVar36,auVar41,2);
        auVar41 = vcmpps_avx(*(undefined1 (*) [16])(uVar10 + 0xe0),auVar40,2);
        auVar40 = vcmpps_avx(auVar40,*(undefined1 (*) [16])(uVar10 + 0xf0),1);
        auVar41 = vandps_avx(auVar41,auVar40);
        auVar41 = vandps_avx(auVar41,auVar53);
      }
      else {
        auVar41 = vcmpps_avx(auVar36,auVar41,2);
      }
      auVar41 = vpslld_avx(auVar41,0x1f);
      uVar11 = vmovmskps_avx(auVar41);
      local_10c0[0] = (RTCHitN)auVar36[0];
      local_10c0[1] = (RTCHitN)auVar36[1];
      local_10c0[2] = (RTCHitN)auVar36[2];
      local_10c0[3] = (RTCHitN)auVar36[3];
      local_10c0[4] = (RTCHitN)auVar36[4];
      local_10c0[5] = (RTCHitN)auVar36[5];
      local_10c0[6] = (RTCHitN)auVar36[6];
      local_10c0[7] = (RTCHitN)auVar36[7];
      local_10c0[8] = (RTCHitN)auVar36[8];
      local_10c0[9] = (RTCHitN)auVar36[9];
      local_10c0[10] = (RTCHitN)auVar36[10];
      local_10c0[0xb] = (RTCHitN)auVar36[0xb];
      local_10c0[0xc] = (RTCHitN)auVar36[0xc];
      local_10c0[0xd] = (RTCHitN)auVar36[0xd];
      local_10c0[0xe] = (RTCHitN)auVar36[0xe];
      local_10c0[0xf] = (RTCHitN)auVar36[0xf];
      if (uVar11 == 0) goto LAB_015eee54;
      uVar11 = uVar11 & 0xff;
      lVar6 = 0;
      for (uVar15 = (ulong)uVar11; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
        lVar6 = lVar6 + 1;
      }
      uVar15 = *(ulong *)(uVar10 + lVar6 * 8);
      uVar11 = uVar11 - 1 & uVar11;
      uVar12 = (ulong)uVar11;
      if (uVar11 != 0) {
        uVar75 = *(uint *)(local_10c0 + lVar6 * 4);
        lVar6 = 0;
        for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
          lVar6 = lVar6 + 1;
        }
        uVar11 = uVar11 - 1 & uVar11;
        uVar16 = (ulong)uVar11;
        uVar12 = *(ulong *)(uVar10 + lVar6 * 8);
        uVar76 = *(uint *)(local_10c0 + lVar6 * 4);
        if (uVar11 == 0) {
          if (uVar75 < uVar76) {
            *(ulong *)*pauVar27 = uVar12;
            *(uint *)(*pauVar27 + 8) = uVar76;
            pauVar27 = pauVar27 + 1;
          }
          else {
            *(ulong *)*pauVar27 = uVar15;
            *(uint *)(*pauVar27 + 8) = uVar75;
            uVar15 = uVar12;
            pauVar27 = pauVar27 + 1;
          }
        }
        else {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar15;
          auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar75));
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar12;
          auVar41 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar76));
          lVar6 = 0;
          for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar6 = lVar6 + 1;
          }
          uVar11 = uVar11 - 1 & uVar11;
          uVar15 = (ulong)uVar11;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)(uVar10 + lVar6 * 8);
          auVar40 = vpunpcklqdq_avx(auVar53,ZEXT416(*(uint *)(local_10c0 + lVar6 * 4)));
          auVar53 = vpcmpgtd_avx(auVar41,auVar36);
          if (uVar11 == 0) {
            auVar60 = vpshufd_avx(auVar53,0xaa);
            auVar53 = vblendvps_avx(auVar41,auVar36,auVar60);
            auVar36 = vblendvps_avx(auVar36,auVar41,auVar60);
            auVar41 = vpcmpgtd_avx(auVar40,auVar53);
            auVar60 = vpshufd_avx(auVar41,0xaa);
            auVar41 = vblendvps_avx(auVar40,auVar53,auVar60);
            auVar53 = vblendvps_avx(auVar53,auVar40,auVar60);
            auVar40 = vpcmpgtd_avx(auVar53,auVar36);
            auVar60 = vpshufd_avx(auVar40,0xaa);
            auVar40 = vblendvps_avx(auVar53,auVar36,auVar60);
            auVar36 = vblendvps_avx(auVar36,auVar53,auVar60);
            *pauVar27 = auVar36;
            pauVar27[1] = auVar40;
            uVar15 = auVar41._0_8_;
            pauVar27 = pauVar27 + 2;
          }
          else {
            lVar6 = 0;
            for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar6 = lVar6 + 1;
            }
            auVar60._8_8_ = 0;
            auVar60._0_8_ = *(ulong *)(uVar10 + lVar6 * 8);
            auVar33 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_10c0 + lVar6 * 4)));
            auVar60 = vpshufd_avx(auVar53,0xaa);
            auVar53 = vblendvps_avx(auVar41,auVar36,auVar60);
            auVar36 = vblendvps_avx(auVar36,auVar41,auVar60);
            auVar41 = vpcmpgtd_avx(auVar33,auVar40);
            auVar60 = vpshufd_avx(auVar41,0xaa);
            auVar41 = vblendvps_avx(auVar33,auVar40,auVar60);
            auVar40 = vblendvps_avx(auVar40,auVar33,auVar60);
            auVar60 = vpcmpgtd_avx(auVar40,auVar36);
            auVar33 = vpshufd_avx(auVar60,0xaa);
            auVar60 = vblendvps_avx(auVar40,auVar36,auVar33);
            auVar36 = vblendvps_avx(auVar36,auVar40,auVar33);
            auVar40 = vpcmpgtd_avx(auVar41,auVar53);
            auVar33 = vpshufd_avx(auVar40,0xaa);
            auVar40 = vblendvps_avx(auVar41,auVar53,auVar33);
            auVar41 = vblendvps_avx(auVar53,auVar41,auVar33);
            auVar53 = vpcmpgtd_avx(auVar60,auVar41);
            auVar33 = vpshufd_avx(auVar53,0xaa);
            auVar53 = vblendvps_avx(auVar60,auVar41,auVar33);
            auVar41 = vblendvps_avx(auVar41,auVar60,auVar33);
            *pauVar27 = auVar36;
            pauVar27[1] = auVar41;
            pauVar27[2] = auVar53;
            uVar15 = auVar40._0_8_;
            pauVar27 = pauVar27 + 3;
          }
        }
      }
    }
    local_12d8 = (ulong)((uint)uVar15 & 0xf) - 8;
    uVar15 = uVar15 & 0xfffffffffffffff0;
    for (local_12c8 = 0; local_12c8 != local_12d8; local_12c8 = local_12c8 + 1) {
      lVar21 = local_12c8 * 0x50;
      pSVar14 = context->scene;
      pGVar3 = (pSVar14->geometries).items[*(uint *)(uVar15 + 0x30 + lVar21)].ptr;
      fVar59 = (pGVar3->time_range).lower;
      fVar59 = pGVar3->fnumTimeSegments *
               ((*(float *)(ray + k * 4 + 0xe0) - fVar59) / ((pGVar3->time_range).upper - fVar59));
      auVar36 = vroundss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59),9);
      auVar36 = vminss_avx(auVar36,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
      auVar42 = vmaxss_avx(ZEXT816(0),auVar36);
      lVar13 = (long)(int)auVar42._0_4_ * 0x38;
      uVar23 = (ulong)*(uint *)(uVar15 + 4 + lVar21);
      lVar6 = *(long *)(*(long *)&pGVar3[2].numPrimitives + lVar13);
      lVar13 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 + lVar13);
      auVar36 = *(undefined1 (*) [16])(lVar6 + (ulong)*(uint *)(uVar15 + lVar21) * 4);
      uVar22 = (ulong)*(uint *)(uVar15 + 0x10 + lVar21);
      auVar41 = *(undefined1 (*) [16])(lVar6 + uVar22 * 4);
      uVar10 = (ulong)*(uint *)(uVar15 + 0x20 + lVar21);
      auVar49 = *(undefined1 (*) [16])(lVar6 + uVar10 * 4);
      auVar53 = *(undefined1 (*) [16])(lVar6 + uVar23 * 4);
      uVar12 = (ulong)*(uint *)(uVar15 + 0x14 + lVar21);
      auVar40 = *(undefined1 (*) [16])(lVar6 + uVar12 * 4);
      uVar16 = (ulong)*(uint *)(uVar15 + 0x24 + lVar21);
      auVar54 = *(undefined1 (*) [16])(lVar6 + uVar16 * 4);
      uVar18 = (ulong)*(uint *)(uVar15 + 8 + lVar21);
      auVar60 = *(undefined1 (*) [16])(lVar6 + uVar18 * 4);
      local_12d0 = (ulong)*(uint *)(uVar15 + 0x18 + lVar21);
      auVar33 = *(undefined1 (*) [16])(lVar6 + local_12d0 * 4);
      uVar24 = (ulong)*(uint *)(uVar15 + 0x28 + lVar21);
      auVar29 = *(undefined1 (*) [16])(lVar6 + uVar24 * 4);
      uVar19 = (ulong)*(uint *)(uVar15 + 0xc + lVar21);
      auVar35 = *(undefined1 (*) [16])(lVar6 + uVar19 * 4);
      uVar25 = (ulong)*(uint *)(uVar15 + 0x1c + lVar21);
      auVar30 = *(undefined1 (*) [16])(lVar6 + uVar25 * 4);
      uVar20 = (ulong)*(uint *)(uVar15 + 0x2c + lVar21);
      auVar31 = *(undefined1 (*) [16])(lVar6 + uVar20 * 4);
      auVar32 = *(undefined1 (*) [16])(lVar13 + (ulong)*(uint *)(uVar15 + lVar21) * 4);
      auVar43 = *(undefined1 (*) [16])(lVar13 + uVar22 * 4);
      fVar59 = fVar59 - auVar42._0_4_;
      auVar42 = vunpcklps_avx(auVar36,auVar60);
      auVar60 = vunpckhps_avx(auVar36,auVar60);
      auVar48 = vunpcklps_avx(auVar53,auVar35);
      auVar53 = vunpckhps_avx(auVar53,auVar35);
      auVar36 = *(undefined1 (*) [16])(lVar13 + uVar23 * 4);
      local_11d0 = vunpcklps_avx(auVar60,auVar53);
      auVar35 = vunpcklps_avx(auVar42,auVar48);
      auVar60 = vunpckhps_avx(auVar42,auVar48);
      auVar42 = vunpcklps_avx(auVar41,auVar33);
      auVar53 = vunpckhps_avx(auVar41,auVar33);
      auVar33 = vunpcklps_avx(auVar40,auVar30);
      auVar40 = vunpckhps_avx(auVar40,auVar30);
      auVar41 = *(undefined1 (*) [16])(lVar13 + uVar18 * 4);
      local_11c0 = vunpcklps_avx(auVar53,auVar40);
      auVar30 = vunpcklps_avx(auVar42,auVar33);
      local_11e0 = vunpckhps_avx(auVar42,auVar33);
      auVar42 = vunpcklps_avx(auVar49,auVar29);
      auVar40 = vunpckhps_avx(auVar49,auVar29);
      auVar29 = vunpcklps_avx(auVar54,auVar31);
      auVar33 = vunpckhps_avx(auVar54,auVar31);
      auVar53 = *(undefined1 (*) [16])(lVar13 + uVar19 * 4);
      local_1310 = vunpcklps_avx(auVar40,auVar33);
      local_1320 = vunpcklps_avx(auVar42,auVar29);
      local_1330 = vunpckhps_avx(auVar42,auVar29);
      auVar40 = vunpcklps_avx(auVar32,auVar41);
      auVar41 = vunpckhps_avx(auVar32,auVar41);
      auVar33 = vunpcklps_avx(auVar36,auVar53);
      auVar53 = vunpckhps_avx(auVar36,auVar53);
      auVar36 = *(undefined1 (*) [16])(lVar13 + local_12d0 * 4);
      auVar29 = vunpcklps_avx(auVar41,auVar53);
      auVar31 = vunpcklps_avx(auVar40,auVar33);
      auVar53 = vunpckhps_avx(auVar40,auVar33);
      auVar33 = vunpcklps_avx(auVar43,auVar36);
      auVar40 = vunpckhps_avx(auVar43,auVar36);
      auVar36 = *(undefined1 (*) [16])(lVar13 + uVar12 * 4);
      auVar41 = *(undefined1 (*) [16])(lVar13 + uVar25 * 4);
      auVar32 = vunpcklps_avx(auVar36,auVar41);
      auVar36 = vunpckhps_avx(auVar36,auVar41);
      auVar43 = vunpcklps_avx(auVar40,auVar36);
      auVar42 = vunpcklps_avx(auVar33,auVar32);
      auVar40 = vunpckhps_avx(auVar33,auVar32);
      auVar36 = *(undefined1 (*) [16])(lVar13 + uVar10 * 4);
      auVar41 = *(undefined1 (*) [16])(lVar13 + uVar24 * 4);
      auVar32 = vunpcklps_avx(auVar36,auVar41);
      auVar33 = vunpckhps_avx(auVar36,auVar41);
      auVar36 = *(undefined1 (*) [16])(lVar13 + uVar16 * 4);
      auVar41 = *(undefined1 (*) [16])(lVar13 + uVar20 * 4);
      auVar48 = vunpcklps_avx(auVar36,auVar41);
      auVar36 = vunpckhps_avx(auVar36,auVar41);
      auVar41 = vunpcklps_avx(auVar33,auVar36);
      auVar33 = vunpcklps_avx(auVar32,auVar48);
      auVar36 = vunpckhps_avx(auVar32,auVar48);
      fVar66 = 1.0 - fVar59;
      auVar83._4_4_ = fVar66;
      auVar83._0_4_ = fVar66;
      auVar83._8_4_ = fVar66;
      auVar83._12_4_ = fVar66;
      auVar61._0_4_ = fVar59 * auVar31._0_4_;
      auVar61._4_4_ = fVar59 * auVar31._4_4_;
      auVar61._8_4_ = fVar59 * auVar31._8_4_;
      auVar61._12_4_ = fVar59 * auVar31._12_4_;
      auVar35 = vfmadd231ps_fma(auVar61,auVar83,auVar35);
      auVar62._0_4_ = fVar59 * auVar53._0_4_;
      auVar62._4_4_ = fVar59 * auVar53._4_4_;
      auVar62._8_4_ = fVar59 * auVar53._8_4_;
      auVar62._12_4_ = fVar59 * auVar53._12_4_;
      auVar31 = vfmadd231ps_fma(auVar62,auVar83,auVar60);
      auVar67._0_4_ = fVar59 * auVar29._0_4_;
      auVar67._4_4_ = fVar59 * auVar29._4_4_;
      auVar67._8_4_ = fVar59 * auVar29._8_4_;
      auVar67._12_4_ = fVar59 * auVar29._12_4_;
      auVar32 = vfmadd231ps_fma(auVar67,auVar83,local_11d0);
      auVar29._0_4_ = fVar59 * auVar42._0_4_;
      auVar29._4_4_ = fVar59 * auVar42._4_4_;
      auVar29._8_4_ = fVar59 * auVar42._8_4_;
      auVar29._12_4_ = fVar59 * auVar42._12_4_;
      auVar53 = vfmadd231ps_fma(auVar29,auVar83,auVar30);
      auVar42._0_4_ = fVar59 * auVar40._0_4_;
      auVar42._4_4_ = fVar59 * auVar40._4_4_;
      auVar42._8_4_ = fVar59 * auVar40._8_4_;
      auVar42._12_4_ = fVar59 * auVar40._12_4_;
      auVar40 = vfmadd231ps_fma(auVar42,auVar83,local_11e0);
      auVar48._0_4_ = fVar59 * auVar43._0_4_;
      auVar48._4_4_ = fVar59 * auVar43._4_4_;
      auVar48._8_4_ = fVar59 * auVar43._8_4_;
      auVar48._12_4_ = fVar59 * auVar43._12_4_;
      auVar60 = vfmadd231ps_fma(auVar48,auVar83,local_11c0);
      puVar1 = (undefined8 *)(uVar15 + 0x30 + lVar21);
      local_11b0 = *puVar1;
      uStack_11a8 = puVar1[1];
      puVar1 = (undefined8 *)(uVar15 + 0x40 + lVar21);
      auVar57._0_4_ = fVar59 * auVar33._0_4_;
      auVar57._4_4_ = fVar59 * auVar33._4_4_;
      auVar57._8_4_ = fVar59 * auVar33._8_4_;
      auVar57._12_4_ = fVar59 * auVar33._12_4_;
      auVar78._0_4_ = fVar59 * auVar36._0_4_;
      auVar78._4_4_ = fVar59 * auVar36._4_4_;
      auVar78._8_4_ = fVar59 * auVar36._8_4_;
      auVar78._12_4_ = fVar59 * auVar36._12_4_;
      auVar86._0_4_ = fVar59 * auVar41._0_4_;
      auVar86._4_4_ = fVar59 * auVar41._4_4_;
      auVar86._8_4_ = fVar59 * auVar41._8_4_;
      auVar86._12_4_ = fVar59 * auVar41._12_4_;
      auVar33 = vfmadd231ps_fma(auVar57,auVar83,local_1320);
      auVar29 = vfmadd231ps_fma(auVar78,auVar83,local_1330);
      auVar30 = vfmadd231ps_fma(auVar86,auVar83,local_1310);
      local_1290 = *puVar1;
      uStack_1288 = puVar1[1];
      auVar41 = vsubps_avx(auVar35,auVar53);
      auVar36 = vsubps_avx(auVar31,auVar40);
      auVar53 = vsubps_avx(auVar32,auVar60);
      auVar40 = vsubps_avx(auVar33,auVar35);
      auVar60 = vsubps_avx(auVar29,auVar31);
      auVar33 = vsubps_avx(auVar30,auVar32);
      auVar43._0_4_ = auVar36._0_4_ * auVar33._0_4_;
      auVar43._4_4_ = auVar36._4_4_ * auVar33._4_4_;
      auVar43._8_4_ = auVar36._8_4_ * auVar33._8_4_;
      auVar43._12_4_ = auVar36._12_4_ * auVar33._12_4_;
      local_1110 = vfmsub231ps_fma(auVar43,auVar60,auVar53);
      auVar54._0_4_ = auVar53._0_4_ * auVar40._0_4_;
      auVar54._4_4_ = auVar53._4_4_ * auVar40._4_4_;
      auVar54._8_4_ = auVar53._8_4_ * auVar40._8_4_;
      auVar54._12_4_ = auVar53._12_4_ * auVar40._12_4_;
      local_1100 = vfmsub231ps_fma(auVar54,auVar33,auVar41);
      uVar9 = *(undefined4 *)(ray + k * 4);
      auVar49._4_4_ = uVar9;
      auVar49._0_4_ = uVar9;
      auVar49._8_4_ = uVar9;
      auVar49._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar58._4_4_ = uVar9;
      auVar58._0_4_ = uVar9;
      auVar58._8_4_ = uVar9;
      auVar58._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar30._4_4_ = uVar9;
      auVar30._0_4_ = uVar9;
      auVar30._8_4_ = uVar9;
      auVar30._12_4_ = uVar9;
      fVar59 = *(float *)(ray + k * 4 + 0x80);
      auVar84._4_4_ = fVar59;
      auVar84._0_4_ = fVar59;
      auVar84._8_4_ = fVar59;
      auVar84._12_4_ = fVar59;
      auVar29 = vsubps_avx(auVar35,auVar49);
      fVar66 = *(float *)(ray + k * 4 + 0xa0);
      auVar88._4_4_ = fVar66;
      auVar88._0_4_ = fVar66;
      auVar88._8_4_ = fVar66;
      auVar88._12_4_ = fVar66;
      auVar35 = vsubps_avx(auVar31,auVar58);
      fVar71 = *(float *)(ray + k * 4 + 0xc0);
      auVar89._4_4_ = fVar71;
      auVar89._0_4_ = fVar71;
      auVar89._8_4_ = fVar71;
      auVar89._12_4_ = fVar71;
      auVar30 = vsubps_avx(auVar32,auVar30);
      auVar31._0_4_ = fVar59 * auVar35._0_4_;
      auVar31._4_4_ = fVar59 * auVar35._4_4_;
      auVar31._8_4_ = fVar59 * auVar35._8_4_;
      auVar31._12_4_ = fVar59 * auVar35._12_4_;
      auVar31 = vfmsub231ps_fma(auVar31,auVar29,auVar88);
      auVar68._0_4_ = auVar33._0_4_ * auVar31._0_4_;
      auVar68._4_4_ = auVar33._4_4_ * auVar31._4_4_;
      auVar68._8_4_ = auVar33._8_4_ * auVar31._8_4_;
      auVar68._12_4_ = auVar33._12_4_ * auVar31._12_4_;
      auVar32._0_4_ = auVar53._0_4_ * auVar31._0_4_;
      auVar32._4_4_ = auVar53._4_4_ * auVar31._4_4_;
      auVar32._8_4_ = auVar53._8_4_ * auVar31._8_4_;
      auVar32._12_4_ = auVar53._12_4_ * auVar31._12_4_;
      auVar63._0_4_ = fVar71 * auVar29._0_4_;
      auVar63._4_4_ = fVar71 * auVar29._4_4_;
      auVar63._8_4_ = fVar71 * auVar29._8_4_;
      auVar63._12_4_ = fVar71 * auVar29._12_4_;
      auVar33 = vfmsub231ps_fma(auVar63,auVar30,auVar84);
      auVar53 = vfmadd231ps_fma(auVar68,auVar33,auVar60);
      auVar33 = vfmadd231ps_fma(auVar32,auVar36,auVar33);
      auVar64._0_4_ = auVar60._0_4_ * auVar41._0_4_;
      auVar64._4_4_ = auVar60._4_4_ * auVar41._4_4_;
      auVar64._8_4_ = auVar60._8_4_ * auVar41._8_4_;
      auVar64._12_4_ = auVar60._12_4_ * auVar41._12_4_;
      local_10f0 = vfmsub231ps_fma(auVar64,auVar40,auVar36);
      auVar79._0_4_ = fVar66 * auVar30._0_4_;
      auVar79._4_4_ = fVar66 * auVar30._4_4_;
      auVar79._8_4_ = fVar66 * auVar30._8_4_;
      auVar79._12_4_ = fVar66 * auVar30._12_4_;
      auVar31 = vfmsub231ps_fma(auVar79,auVar35,auVar89);
      auVar81._0_4_ = fVar71 * local_10f0._0_4_;
      auVar81._4_4_ = fVar71 * local_10f0._4_4_;
      auVar81._8_4_ = fVar71 * local_10f0._8_4_;
      auVar81._12_4_ = fVar71 * local_10f0._12_4_;
      auVar36 = vfmadd231ps_fma(auVar81,local_1100,auVar88);
      auVar60 = vfmadd231ps_fma(auVar36,local_1110,auVar84);
      auVar53 = vfmadd231ps_fma(auVar53,auVar31,auVar40);
      auVar36 = vandps_avx(auVar60,local_1220);
      uVar11 = auVar36._0_4_;
      local_11a0._0_4_ = (float)(uVar11 ^ auVar53._0_4_);
      uVar75 = auVar36._4_4_;
      local_11a0._4_4_ = (float)(uVar75 ^ auVar53._4_4_);
      uVar76 = auVar36._8_4_;
      local_11a0._8_4_ = (float)(uVar76 ^ auVar53._8_4_);
      uVar77 = auVar36._12_4_;
      local_11a0._12_4_ = (float)(uVar77 ^ auVar53._12_4_);
      auVar36 = vfmadd231ps_fma(auVar33,auVar41,auVar31);
      local_1190._0_4_ = (float)(uVar11 ^ auVar36._0_4_);
      local_1190._4_4_ = (float)(uVar75 ^ auVar36._4_4_);
      local_1190._8_4_ = (float)(uVar76 ^ auVar36._8_4_);
      local_1190._12_4_ = (float)(uVar77 ^ auVar36._12_4_);
      auVar53 = ZEXT816(0) << 0x20;
      auVar36 = vcmpps_avx(local_11a0,auVar53,5);
      auVar41 = vcmpps_avx(local_1190,auVar53,5);
      auVar36 = vandps_avx(auVar41,auVar36);
      auVar69._8_4_ = 0x7fffffff;
      auVar69._0_8_ = 0x7fffffff7fffffff;
      auVar69._12_4_ = 0x7fffffff;
      local_1170 = vandps_avx(auVar60,auVar69);
      auVar41 = vcmpps_avx(auVar60,auVar53,4);
      auVar36 = vandps_avx(auVar41,auVar36);
      auVar33._0_4_ = local_11a0._0_4_ + local_1190._0_4_;
      auVar33._4_4_ = local_11a0._4_4_ + local_1190._4_4_;
      auVar33._8_4_ = local_11a0._8_4_ + local_1190._8_4_;
      auVar33._12_4_ = local_11a0._12_4_ + local_1190._12_4_;
      auVar41 = vcmpps_avx(auVar33,local_1170,2);
      auVar53 = auVar41 & auVar36;
      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar53[0xf] < '\0'
         ) {
        auVar36 = vandps_avx(auVar36,auVar41);
        auVar34._0_4_ = local_10f0._0_4_ * auVar30._0_4_;
        auVar34._4_4_ = local_10f0._4_4_ * auVar30._4_4_;
        auVar34._8_4_ = local_10f0._8_4_ * auVar30._8_4_;
        auVar34._12_4_ = local_10f0._12_4_ * auVar30._12_4_;
        auVar41 = vfmadd213ps_fma(auVar35,local_1100,auVar34);
        auVar41 = vfmadd213ps_fma(auVar29,local_1110,auVar41);
        local_1180._0_4_ = (float)(uVar11 ^ auVar41._0_4_);
        local_1180._4_4_ = (float)(uVar75 ^ auVar41._4_4_);
        local_1180._8_4_ = (float)(uVar76 ^ auVar41._8_4_);
        local_1180._12_4_ = (float)(uVar77 ^ auVar41._12_4_);
        fVar59 = *(float *)(ray + k * 4 + 0x60);
        auVar35._0_4_ = local_1170._0_4_ * fVar59;
        auVar35._4_4_ = local_1170._4_4_ * fVar59;
        auVar35._8_4_ = local_1170._8_4_ * fVar59;
        auVar35._12_4_ = local_1170._12_4_ * fVar59;
        auVar41 = vcmpps_avx(auVar35,local_1180,1);
        fVar59 = *(float *)(ray + k * 4 + 0x100);
        auVar50._0_4_ = local_1170._0_4_ * fVar59;
        auVar50._4_4_ = local_1170._4_4_ * fVar59;
        auVar50._8_4_ = local_1170._8_4_ * fVar59;
        auVar50._12_4_ = local_1170._12_4_ * fVar59;
        auVar53 = vcmpps_avx(local_1180,auVar50,2);
        auVar41 = vandps_avx(auVar41,auVar53);
        auVar53 = auVar36 & auVar41;
        if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar53[0xf] < '\0') {
          local_1350 = vandps_avx(auVar36,auVar41);
          local_1150 = local_1350;
          auVar36 = vrcpps_avx(local_1170);
          auVar44._8_4_ = 0x3f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          auVar44._12_4_ = 0x3f800000;
          auVar41 = vfnmadd213ps_fma(local_1170,auVar36,auVar44);
          auVar36 = vfmadd132ps_fma(auVar41,auVar36,auVar36);
          fVar66 = auVar36._0_4_;
          local_1120._0_4_ = fVar66 * local_1180._0_4_;
          fVar71 = auVar36._4_4_;
          local_1120._4_4_ = fVar71 * local_1180._4_4_;
          fVar72 = auVar36._8_4_;
          local_1120._8_4_ = fVar72 * local_1180._8_4_;
          fVar73 = auVar36._12_4_;
          local_1120._12_4_ = fVar73 * local_1180._12_4_;
          auVar39 = ZEXT1664(local_1120);
          local_1140[0] = fVar66 * local_11a0._0_4_;
          local_1140[1] = fVar71 * local_11a0._4_4_;
          local_1140[2] = fVar72 * local_11a0._8_4_;
          local_1140[3] = fVar73 * local_11a0._12_4_;
          auVar45._8_4_ = 0x7f800000;
          auVar45._0_8_ = 0x7f8000007f800000;
          auVar45._12_4_ = 0x7f800000;
          auVar36 = vblendvps_avx(auVar45,local_1120,local_1350);
          local_1130[0] = fVar66 * local_1190._0_4_;
          local_1130[1] = fVar71 * local_1190._4_4_;
          local_1130[2] = fVar72 * local_1190._8_4_;
          local_1130[3] = fVar73 * local_1190._12_4_;
          auVar41 = vshufps_avx(auVar36,auVar36,0xb1);
          auVar41 = vminps_avx(auVar41,auVar36);
          auVar53 = vshufpd_avx(auVar41,auVar41,1);
          auVar41 = vminps_avx(auVar53,auVar41);
          auVar36 = vcmpps_avx(auVar36,auVar41,0);
          auVar53 = local_1350 & auVar36;
          auVar41 = vpcmpeqd_avx(auVar41,auVar41);
          if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar53[0xf] < '\0') {
            auVar41 = auVar36;
          }
          auVar36 = vandps_avx(local_1350,auVar41);
          local_1338 = pSVar14;
          do {
            auVar36 = vpslld_avx(auVar36,0x1f);
            uVar9 = vmovmskps_avx(auVar36);
            uVar22 = 0;
            for (uVar20 = CONCAT44((int)(uVar20 >> 0x20),uVar9); (uVar20 & 1) == 0;
                uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              uVar22 = uVar22 + 1;
            }
            uVar11 = *(uint *)((long)&local_11b0 + uVar22 * 4);
            uVar20 = (ulong)uVar11;
            pGVar3 = (pSVar14->geometries).items[uVar20].ptr;
            if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_1350 + uVar22 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar20 = (ulong)(uint)((int)uVar22 << 2);
                uVar9 = *(undefined4 *)((long)local_1140 + uVar20);
                uVar2 = *(undefined4 *)((long)local_1130 + uVar20);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1120 + uVar20);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1110 + uVar20);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1100 + uVar20);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_10f0 + uVar20);
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar9;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)((long)&local_1290 + uVar20);
                *(uint *)(ray + k * 4 + 0x240) = uVar11;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                break;
              }
              local_1300 = auVar39._0_16_;
              uVar20 = (ulong)(uint)((int)uVar22 * 4);
              uVar9 = *(undefined4 *)((long)local_1140 + uVar20);
              local_1060._4_4_ = uVar9;
              local_1060._0_4_ = uVar9;
              local_1060._8_4_ = uVar9;
              local_1060._12_4_ = uVar9;
              local_1060._16_4_ = uVar9;
              local_1060._20_4_ = uVar9;
              local_1060._24_4_ = uVar9;
              local_1060._28_4_ = uVar9;
              local_1040 = *(undefined4 *)((long)local_1130 + uVar20);
              uVar9 = *(undefined4 *)((long)&local_1290 + uVar20);
              auVar55._4_4_ = uVar9;
              auVar55._0_4_ = uVar9;
              auVar55._8_4_ = uVar9;
              auVar55._12_4_ = uVar9;
              auVar56._16_4_ = uVar9;
              auVar56._0_16_ = auVar55;
              auVar56._20_4_ = uVar9;
              auVar56._24_4_ = uVar9;
              auVar56._28_4_ = uVar9;
              local_10c0._4_4_ = *(undefined4 *)(local_1110 + uVar20);
              local_10a0 = *(undefined4 *)(local_1100 + uVar20);
              uVar9 = *(undefined4 *)(local_10f0 + uVar20);
              local_1080._4_4_ = uVar9;
              local_1080._0_4_ = uVar9;
              local_1080._8_4_ = uVar9;
              local_1080._12_4_ = uVar9;
              local_1080._16_4_ = uVar9;
              local_1080._20_4_ = uVar9;
              local_1080._24_4_ = uVar9;
              local_1080._28_4_ = uVar9;
              auVar51._4_4_ = uVar11;
              auVar51._0_4_ = uVar11;
              auVar51._8_4_ = uVar11;
              auVar51._12_4_ = uVar11;
              auVar52._16_4_ = uVar11;
              auVar52._0_16_ = auVar51;
              auVar52._20_4_ = uVar11;
              auVar52._24_4_ = uVar11;
              auVar52._28_4_ = uVar11;
              local_10c0._0_4_ = local_10c0._4_4_;
              local_10c0._8_4_ = local_10c0._4_4_;
              local_10c0._12_4_ = local_10c0._4_4_;
              local_10c0[0x10] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x11] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              local_10c0[0x14] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x15] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              local_10c0[0x18] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x19] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              local_10c0[0x1c] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x1d] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              uStack_109c = local_10a0;
              uStack_1098 = local_10a0;
              uStack_1094 = local_10a0;
              uStack_1090 = local_10a0;
              uStack_108c = local_10a0;
              uStack_1088 = local_10a0;
              uStack_1084 = local_10a0;
              uStack_103c = local_1040;
              uStack_1038 = local_1040;
              uStack_1034 = local_1040;
              uStack_1030 = local_1040;
              uStack_102c = local_1040;
              uStack_1028 = local_1040;
              uStack_1024 = local_1040;
              local_1020 = auVar56;
              local_1000 = auVar52;
              vpcmpeqd_avx2(local_1060,local_1060);
              uStack_fdc = context->user->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = context->user->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1120 + uVar20);
              local_1280 = local_10e0;
              local_12c0.valid = (int *)local_1280;
              local_12c0.geometryUserPtr = pGVar3->userPtr;
              local_12c0.context = context->user;
              local_12c0.hit = local_10c0;
              local_12c0.N = 8;
              local_12c0.ray = (RTCRayN *)ray;
              if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar52 = ZEXT1632(auVar51);
                auVar56 = ZEXT1632(auVar55);
                (*pGVar3->intersectionFilterN)(&local_12c0);
              }
              auVar38 = vpcmpeqd_avx2(local_1280,_DAT_01f7b000);
              auVar47 = _DAT_01f7b020 & ~auVar38;
              if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar47 >> 0x7f,0) == '\0') &&
                    (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar47 >> 0xbf,0) == '\0') &&
                  (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar47[0x1f]) {
                auVar38 = auVar38 ^ _DAT_01f7b020;
              }
              else {
                p_Var4 = context->args->filter;
                if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar52 = ZEXT1632(auVar52._0_16_);
                  auVar56 = ZEXT1632(auVar56._0_16_);
                  (*p_Var4)(&local_12c0);
                }
                auVar5 = vpcmpeqd_avx2(local_1280,_DAT_01f7b000);
                auVar47 = vpcmpeqd_avx2(auVar56,auVar56);
                auVar38 = auVar5 ^ auVar47;
                auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
                auVar47 = auVar47 & ~auVar5;
                if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar47 >> 0x7f,0) != '\0') ||
                      (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar47 >> 0xbf,0) != '\0') ||
                    (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar47[0x1f] < '\0') {
                  auVar5 = auVar5 ^ auVar52;
                  auVar47 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])local_12c0.hit);
                  *(undefined1 (*) [32])(local_12c0.ray + 0x180) = auVar47;
                  auVar47 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])(local_12c0.hit + 0x20));
                  *(undefined1 (*) [32])(local_12c0.ray + 0x1a0) = auVar47;
                  auVar47 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])(local_12c0.hit + 0x40));
                  *(undefined1 (*) [32])(local_12c0.ray + 0x1c0) = auVar47;
                  auVar47 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])(local_12c0.hit + 0x60));
                  *(undefined1 (*) [32])(local_12c0.ray + 0x1e0) = auVar47;
                  auVar47 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])(local_12c0.hit + 0x80));
                  *(undefined1 (*) [32])(local_12c0.ray + 0x200) = auVar47;
                  auVar47 = vpmaskmovd_avx2(auVar5,*(undefined1 (*) [32])(local_12c0.hit + 0xa0));
                  *(undefined1 (*) [32])(local_12c0.ray + 0x220) = auVar47;
                  auVar47 = vpmaskmovd_avx2(auVar5,*(undefined1 (*) [32])(local_12c0.hit + 0xc0));
                  *(undefined1 (*) [32])(local_12c0.ray + 0x240) = auVar47;
                  auVar47 = vpmaskmovd_avx2(auVar5,*(undefined1 (*) [32])(local_12c0.hit + 0xe0));
                  *(undefined1 (*) [32])(local_12c0.ray + 0x260) = auVar47;
                  auVar47 = vpmaskmovd_avx2(auVar5,*(undefined1 (*) [32])(local_12c0.hit + 0x100));
                  *(undefined1 (*) [32])(local_12c0.ray + 0x280) = auVar47;
                }
              }
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0x7f,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar38 >> 0xbf,0) == '\0') &&
                  (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar38[0x1f]) {
                *(float *)(ray + k * 4 + 0x100) = fVar59;
              }
              else {
                fVar59 = *(float *)(ray + k * 4 + 0x100);
              }
              *(undefined4 *)(local_1350 + uVar22 * 4) = 0;
              auVar37._4_4_ = fVar59;
              auVar37._0_4_ = fVar59;
              auVar37._8_4_ = fVar59;
              auVar37._12_4_ = fVar59;
              auVar39 = ZEXT1664(local_1300);
              auVar36 = vcmpps_avx(local_1300,auVar37,2);
              local_1350 = vandps_avx(auVar36,local_1350);
              uVar20 = uVar22;
              pSVar14 = local_1338;
            }
            if ((((local_1350 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_1350 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_1350 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_1350[0xf]) break;
            auVar46._8_4_ = 0x7f800000;
            auVar46._0_8_ = 0x7f8000007f800000;
            auVar46._12_4_ = 0x7f800000;
            auVar36 = vblendvps_avx(auVar46,auVar39._0_16_,local_1350);
            auVar41 = vshufps_avx(auVar36,auVar36,0xb1);
            auVar41 = vminps_avx(auVar41,auVar36);
            auVar53 = vshufpd_avx(auVar41,auVar41,1);
            auVar41 = vminps_avx(auVar53,auVar41);
            auVar41 = vcmpps_avx(auVar36,auVar41,0);
            auVar53 = local_1350 & auVar41;
            auVar36 = local_1350;
            if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar53[0xf] < '\0') {
              auVar36 = vandps_avx(auVar41,local_1350);
            }
            auVar36 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar36);
          } while( true );
        }
      }
      auVar65 = ZEXT1664(local_11f0);
      auVar70 = ZEXT1664(local_1200);
      auVar74 = ZEXT1664(local_1210);
      auVar80 = ZEXT1664(local_1230);
      auVar82 = ZEXT1664(local_1240);
      auVar85 = ZEXT1664(local_1250);
      auVar87 = ZEXT1664(local_1260);
      uVar20 = local_12e0;
      uVar22 = local_12e8;
    }
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar39 = ZEXT1664(CONCAT412(uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }